

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void crnlib::SelectorNode::sort_task(uint64 data,void *ptr)

{
  void *ptr_local;
  uint64 data_local;
  
  std::sort<unsigned_long_long*>(*ptr,*(unsigned_long_long **)((long)ptr + 8));
  return;
}

Assistant:

static void sort_task(uint64 data, void* ptr)
        {
            std::sort(((SelectorNode*)ptr)->p, ((SelectorNode*)ptr)->pEnd);
        }